

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::emit_unrolled_binary_op
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,uint32_t op1,
          char *op,bool negate,BaseType expected_type)

{
  BaseType BVar1;
  bool bVar2;
  SPIRType *pSVar3;
  SPIRType *pSVar4;
  SPIRType *type;
  uint index;
  string expr;
  string local_310;
  string local_2f0;
  SPIRType target_type1;
  SPIRType target_type0;
  
  pSVar3 = Compiler::expression_type(&this->super_Compiler,op0);
  pSVar4 = Compiler::expression_type(&this->super_Compiler,op1);
  SPIRType::SPIRType(&target_type0,pSVar3);
  SPIRType::SPIRType(&target_type1,pSVar4);
  target_type0.basetype = expected_type;
  target_type1.basetype = expected_type;
  target_type1.vecsize = 1;
  target_type0.vecsize = target_type1.vecsize;
  type = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,result_type);
  type_to_glsl_constructor_abi_cxx11_(&expr,this,type);
  ::std::__cxx11::string::push_back((char)&expr);
  index = 0;
  while (index < type->vecsize) {
    if (negate) {
      ::std::__cxx11::string::append((char *)&expr);
    }
    if ((expected_type == Unknown) || (BVar1 = pSVar3->basetype, BVar1 == expected_type)) {
      to_extract_component_expression_abi_cxx11_(&local_310,this,op0,index);
      ::std::__cxx11::string::append((string *)&expr);
      ::std::__cxx11::string::~string((string *)&local_310);
    }
    else {
      to_extract_component_expression_abi_cxx11_(&local_2f0,this,op0,index);
      bitcast_expression(&local_310,this,&target_type0,BVar1,&local_2f0);
      ::std::__cxx11::string::append((string *)&expr);
      ::std::__cxx11::string::~string((string *)&local_310);
      ::std::__cxx11::string::~string((string *)&local_2f0);
    }
    ::std::__cxx11::string::push_back((char)&expr);
    ::std::__cxx11::string::append((char *)&expr);
    ::std::__cxx11::string::push_back((char)&expr);
    if ((expected_type == Unknown) || (BVar1 = pSVar4->basetype, BVar1 == expected_type)) {
      to_extract_component_expression_abi_cxx11_(&local_310,this,op1,index);
      ::std::__cxx11::string::append((string *)&expr);
      ::std::__cxx11::string::~string((string *)&local_310);
    }
    else {
      to_extract_component_expression_abi_cxx11_(&local_2f0,this,op1,index);
      bitcast_expression(&local_310,this,&target_type1,BVar1,&local_2f0);
      ::std::__cxx11::string::append((string *)&expr);
      ::std::__cxx11::string::~string((string *)&local_310);
      ::std::__cxx11::string::~string((string *)&local_2f0);
    }
    if (negate) {
      ::std::__cxx11::string::append((char *)&expr);
    }
    index = index + 1;
    if (index < type->vecsize) {
      ::std::__cxx11::string::append((char *)&expr);
    }
  }
  ::std::__cxx11::string::push_back((char)&expr);
  bVar2 = should_forward(this,op0);
  if (bVar2) {
    bVar2 = should_forward(this,op1);
  }
  else {
    bVar2 = false;
  }
  emit_op(this,result_type,result_id,&expr,bVar2,false);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op0);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op1);
  ::std::__cxx11::string::~string((string *)&expr);
  SPIRType::~SPIRType(&target_type1);
  SPIRType::~SPIRType(&target_type0);
  return;
}

Assistant:

void CompilerGLSL::emit_unrolled_binary_op(uint32_t result_type, uint32_t result_id, uint32_t op0, uint32_t op1,
                                           const char *op, bool negate, SPIRType::BaseType expected_type)
{
	auto &type0 = expression_type(op0);
	auto &type1 = expression_type(op1);

	SPIRType target_type0 = type0;
	SPIRType target_type1 = type1;
	target_type0.basetype = expected_type;
	target_type1.basetype = expected_type;
	target_type0.vecsize = 1;
	target_type1.vecsize = 1;

	auto &type = get<SPIRType>(result_type);
	auto expr = type_to_glsl_constructor(type);
	expr += '(';
	for (uint32_t i = 0; i < type.vecsize; i++)
	{
		// Make sure to call to_expression multiple times to ensure
		// that these expressions are properly flushed to temporaries if needed.
		if (negate)
			expr += "!(";

		if (expected_type != SPIRType::Unknown && type0.basetype != expected_type)
			expr += bitcast_expression(target_type0, type0.basetype, to_extract_component_expression(op0, i));
		else
			expr += to_extract_component_expression(op0, i);

		expr += ' ';
		expr += op;
		expr += ' ';

		if (expected_type != SPIRType::Unknown && type1.basetype != expected_type)
			expr += bitcast_expression(target_type1, type1.basetype, to_extract_component_expression(op1, i));
		else
			expr += to_extract_component_expression(op1, i);

		if (negate)
			expr += ")";

		if (i + 1 < type.vecsize)
			expr += ", ";
	}
	expr += ')';
	emit_op(result_type, result_id, expr, should_forward(op0) && should_forward(op1));

	inherit_expression_dependencies(result_id, op0);
	inherit_expression_dependencies(result_id, op1);
}